

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t argument;
  sysbvm_bitflags_t applicationFlags;
  size_t sVar2;
  size_t argumentCount_00;
  anon_struct_24_3_53f9e59d gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_tuple_t local_148;
  sysbvm_tuple_t sStack_140;
  sysbvm_tuple_t local_138;
  sysbvm_stackFrameRecord_t local_130;
  undefined8 local_120;
  sysbvm_stackFrameRecord_t local_118;
  undefined8 local_108;
  anon_struct_136_2_7a050327_for_gcRoots *local_100;
  sysbvm_stackFrameRecord_t local_f8;
  undefined8 local_e8;
  undefined1 *local_e0;
  sysbvm_functionCallFrameStack_t local_d8;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_148 = 0;
  sStack_140 = 0;
  argumentCount_00 = 0;
  local_138 = 0;
  local_f8.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_f8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_f8._12_4_ = 0;
  local_e8 = 3;
  local_e0 = (undefined1 *)&local_148;
  sysbvm_stackFrame_pushRecord(&local_f8);
  local_130.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_130.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_120 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_130);
  uVar1 = *(ulong *)(*arguments + 0x30);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    argumentCount_00 = (size_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  local_148 = sysbvm_interpreter_evaluateASTWithEnvironment
                        (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  memset(&local_d8,0,0xb0);
  local_118.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_118.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_118._12_4_ = 0;
  local_108 = 0x11;
  local_100 = &local_d8.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_118);
  uVar1 = *(ulong *)(*arguments + 0x38);
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    applicationFlags = (long)uVar1 >> 4;
  }
  else {
    applicationFlags = *(sysbvm_bitflags_t *)(uVar1 + 0x10);
  }
  sysbvm_functionCallFrameStack_begin(context,&local_d8,local_148,argumentCount_00,applicationFlags)
  ;
  if (argumentCount_00 != 0) {
    sVar2 = 0;
    do {
      uVar1 = *(ulong *)(*arguments + 0x30);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        sStack_140 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar2 * 8);
      }
      else {
        sStack_140 = 0;
      }
      argument = sysbvm_interpreter_evaluateASTWithEnvironment(context,sStack_140,arguments[1]);
      sysbvm_functionCallFrameStack_push(&local_d8,argument);
      sVar2 = sVar2 + 1;
    } while (argumentCount_00 != sVar2);
  }
  sysbvm_stackFrame_popRecord(&local_118);
  local_138 = sysbvm_functionCallFrameStack_finish(context,&local_d8);
  sysbvm_stackFrame_popRecord(&local_130);
  sysbvm_stackFrame_popRecord(&local_f8);
  return local_138;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astFunctionApplicationNode_t **applicationNode = (sysbvm_astFunctionApplicationNode_t**)node;
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*applicationNode)->super.sourcePosition);

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
    gcFrame.function = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*applicationNode)->functionExpression, *environment);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.function, applicationArgumentCount, sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags));

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}